

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ArrayFeatureType::~ArrayFeatureType(ArrayFeatureType *this)

{
  ArrayFeatureType *this_local;
  
  ~ArrayFeatureType(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

ArrayFeatureType::~ArrayFeatureType() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.ArrayFeatureType)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}